

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPreviewSurface>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPreviewSurface *surface,string *warn,string *err,PrimReconstructOptions *options)

{
  _Base_ptr __x;
  Property *prop;
  optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *this;
  optional<tinyusdz::Animatable<int>_> *this_00;
  _Base_ptr *pp_Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar6;
  undefined4 uVar7;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  ostringstream oVar11;
  __type _Var12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  ostream *poVar16;
  value_type *pvVar17;
  value_type *pvVar18;
  value_type_conflict6 *pvVar19;
  value_type *pvVar20;
  float *pfVar21;
  size_type sVar22;
  mapped_type *this_01;
  _Base_ptr p_Var23;
  Property *pPVar24;
  _Base_ptr args;
  _Rb_tree_header *p_Var25;
  string *psVar26;
  optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *args_1;
  allocator local_5ea;
  allocator local_5e9;
  ParseResult ret_10;
  Animatable<tinyusdz::value::normal3f> animatable_value;
  ParseResult ret;
  string attr_type_name;
  optional<tinyusdz::value::normal3f> pv_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string local_4d0;
  optional<tinyusdz::value::normal3f> pv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  ostringstream ss_e;
  storage_t<int> sStack_3b4;
  undefined1 auStack_3b0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_3a8 [23];
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ::std::__cxx11::string::string((string *)&ss_e,"info:id",(allocator *)&ret);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e);
  ::std::__cxx11::string::_M_dispose();
  p_Var23 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var25 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
  this = &(surface->normal)._attrib;
  this_00 = &(surface->useSpecularWorkflow)._attrib;
  while( true ) {
    if ((_Rb_tree_header *)p_Var23 == p_Var25) break;
    __x = p_Var23 + 1;
    ::std::__cxx11::string::string((string *)&local_50,(string *)__x);
    prop = (Property *)(p_Var23 + 2);
    ::std::__cxx11::string::string
              ((string *)&ss_e,"inputs:diffuseColor",(allocator *)&animatable_value);
    psVar26 = (string *)&ss_e;
    anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
              (&ret,&table,&local_50,prop,(string *)&ss_e,&surface->diffuseColor);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    iVar15 = 0;
    if ((ret.code & ~AlreadyProcessed) == Success) {
      bVar13 = false;
      iVar15 = 3;
    }
    else {
      bVar13 = true;
      if (ret.code != Unmatched) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar16 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar16 = ::std::operator<<(poVar16,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   );
        poVar16 = ::std::operator<<(poVar16,":");
        poVar16 = ::std::operator<<(poVar16,"ReconstructShader");
        poVar16 = ::std::operator<<(poVar16,"():");
        poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xf98);
        ::std::operator<<(poVar16," ");
        ::std::__cxx11::string::string
                  ((string *)&ret_10,"Parsing attribute `{}` failed. Error: {}",
                   (allocator *)&attr_type_name);
        fmt::format<char[20],std::__cxx11::string>
                  ((string *)&animatable_value,(fmt *)&ret_10,(string *)"inputs:diffuseColor",
                   (char (*) [20])&ret.err,psVar26);
        poVar16 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
        ::std::operator<<(poVar16,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &animatable_value,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ret_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)err);
          ::std::__cxx11::string::operator=((string *)err,(string *)&animatable_value);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        bVar13 = false;
        iVar15 = 1;
      }
    }
    ::std::__cxx11::string::_M_dispose();
    if (bVar13) {
      ::std::__cxx11::string::string((string *)&local_70,(string *)__x);
      ::std::__cxx11::string::string
                ((string *)&ss_e,"inputs:emissiveColor",(allocator *)&animatable_value);
      psVar26 = (string *)&ss_e;
      anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
                (&ret,&table,&local_70,prop,(string *)&ss_e,&surface->emissiveColor);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar15 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar13 = false;
        iVar15 = 3;
      }
      else {
        bVar13 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar16 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar16 = ::std::operator<<(poVar16,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar16 = ::std::operator<<(poVar16,":");
          poVar16 = ::std::operator<<(poVar16,"ReconstructShader");
          poVar16 = ::std::operator<<(poVar16,"():");
          poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xf9a);
          ::std::operator<<(poVar16," ");
          ::std::__cxx11::string::string
                    ((string *)&ret_10,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&attr_type_name);
          fmt::format<char[21],std::__cxx11::string>
                    ((string *)&animatable_value,(fmt *)&ret_10,(string *)"inputs:emissiveColor",
                     (char (*) [21])&ret.err,psVar26);
          poVar16 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
          ::std::operator<<(poVar16,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &animatable_value,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&animatable_value);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar13 = false;
          iVar15 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar13) goto LAB_001c7208;
      ::std::__cxx11::string::string((string *)&local_90,(string *)__x);
      ::std::__cxx11::string::string
                ((string *)&ss_e,"inputs:roughness",(allocator *)&animatable_value);
      psVar26 = (string *)&ss_e;
      anon_unknown_0::ParseTypedAttribute<float>
                (&ret,&table,&local_90,prop,(string *)&ss_e,&surface->roughness);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar15 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar13 = false;
        iVar15 = 3;
      }
      else {
        bVar13 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar16 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar16 = ::std::operator<<(poVar16,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar16 = ::std::operator<<(poVar16,":");
          poVar16 = ::std::operator<<(poVar16,"ReconstructShader");
          poVar16 = ::std::operator<<(poVar16,"():");
          poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xf9c);
          ::std::operator<<(poVar16," ");
          ::std::__cxx11::string::string
                    ((string *)&ret_10,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&attr_type_name);
          fmt::format<char[17],std::__cxx11::string>
                    ((string *)&animatable_value,(fmt *)&ret_10,(string *)"inputs:roughness",
                     (char (*) [17])&ret.err,psVar26);
          poVar16 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
          ::std::operator<<(poVar16,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &animatable_value,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&animatable_value);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar13 = false;
          iVar15 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar13) goto LAB_001c7208;
      ::std::__cxx11::string::string((string *)&local_b0,(string *)__x);
      ::std::__cxx11::string::string
                ((string *)&ss_e,"inputs:specularColor",(allocator *)&animatable_value);
      psVar26 = (string *)&ss_e;
      anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
                (&ret,&table,&local_b0,prop,(string *)&ss_e,&surface->specularColor);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar15 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar13 = false;
        iVar15 = 3;
      }
      else {
        bVar13 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar16 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar16 = ::std::operator<<(poVar16,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar16 = ::std::operator<<(poVar16,":");
          poVar16 = ::std::operator<<(poVar16,"ReconstructShader");
          poVar16 = ::std::operator<<(poVar16,"():");
          poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xf9e);
          ::std::operator<<(poVar16," ");
          ::std::__cxx11::string::string
                    ((string *)&ret_10,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&attr_type_name);
          fmt::format<char[21],std::__cxx11::string>
                    ((string *)&animatable_value,(fmt *)&ret_10,(string *)"inputs:specularColor",
                     (char (*) [21])&ret.err,psVar26);
          poVar16 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
          ::std::operator<<(poVar16,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &animatable_value,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&animatable_value);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar13 = false;
          iVar15 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar13) goto LAB_001c7208;
      ::std::__cxx11::string::string((string *)&local_d0,(string *)__x);
      ::std::__cxx11::string::string
                ((string *)&ss_e,"inputs:metallic",(allocator *)&animatable_value);
      psVar26 = (string *)&ss_e;
      anon_unknown_0::ParseTypedAttribute<float>
                (&ret,&table,&local_d0,prop,(string *)&ss_e,&surface->metallic);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar15 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar13 = false;
        iVar15 = 3;
      }
      else {
        bVar13 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar16 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar16 = ::std::operator<<(poVar16,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar16 = ::std::operator<<(poVar16,":");
          poVar16 = ::std::operator<<(poVar16,"ReconstructShader");
          poVar16 = ::std::operator<<(poVar16,"():");
          poVar16 = (ostream *)::std::ostream::operator<<(poVar16,4000);
          ::std::operator<<(poVar16," ");
          ::std::__cxx11::string::string
                    ((string *)&ret_10,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&attr_type_name);
          fmt::format<char[16],std::__cxx11::string>
                    ((string *)&animatable_value,(fmt *)&ret_10,(string *)"inputs:metallic",
                     (char (*) [16])&ret.err,psVar26);
          poVar16 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
          ::std::operator<<(poVar16,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &animatable_value,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&animatable_value);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar13 = false;
          iVar15 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar13) goto LAB_001c7208;
      ::std::__cxx11::string::string((string *)&local_f0,(string *)__x);
      ::std::__cxx11::string::string
                ((string *)&ss_e,"inputs:clearcoat",(allocator *)&animatable_value);
      psVar26 = (string *)&ss_e;
      anon_unknown_0::ParseTypedAttribute<float>
                (&ret,&table,&local_f0,prop,(string *)&ss_e,&surface->clearcoat);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar15 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar13 = false;
        iVar15 = 3;
      }
      else {
        bVar13 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar16 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar16 = ::std::operator<<(poVar16,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar16 = ::std::operator<<(poVar16,":");
          poVar16 = ::std::operator<<(poVar16,"ReconstructShader");
          poVar16 = ::std::operator<<(poVar16,"():");
          poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xfa2);
          ::std::operator<<(poVar16," ");
          ::std::__cxx11::string::string
                    ((string *)&ret_10,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&attr_type_name);
          fmt::format<char[17],std::__cxx11::string>
                    ((string *)&animatable_value,(fmt *)&ret_10,(string *)"inputs:clearcoat",
                     (char (*) [17])&ret.err,psVar26);
          poVar16 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
          ::std::operator<<(poVar16,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &animatable_value,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&animatable_value);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar13 = false;
          iVar15 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar13) goto LAB_001c7208;
      ::std::__cxx11::string::string((string *)&local_110,(string *)__x);
      ::std::__cxx11::string::string
                ((string *)&ss_e,"inputs:clearcoatRoughness",(allocator *)&animatable_value);
      psVar26 = (string *)&ss_e;
      anon_unknown_0::ParseTypedAttribute<float>
                (&ret,&table,&local_110,prop,(string *)&ss_e,&surface->clearcoatRoughness);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar15 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar13 = false;
        iVar15 = 3;
      }
      else {
        bVar13 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar16 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar16 = ::std::operator<<(poVar16,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar16 = ::std::operator<<(poVar16,":");
          poVar16 = ::std::operator<<(poVar16,"ReconstructShader");
          poVar16 = ::std::operator<<(poVar16,"():");
          poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xfa4);
          ::std::operator<<(poVar16," ");
          ::std::__cxx11::string::string
                    ((string *)&ret_10,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&attr_type_name);
          fmt::format<char[26],std::__cxx11::string>
                    ((string *)&animatable_value,(fmt *)&ret_10,
                     (string *)"inputs:clearcoatRoughness",(char (*) [26])&ret.err,psVar26);
          poVar16 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
          ::std::operator<<(poVar16,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &animatable_value,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&animatable_value);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar13 = false;
          iVar15 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar13) goto LAB_001c7208;
      ::std::__cxx11::string::string((string *)&local_130,(string *)__x);
      ::std::__cxx11::string::string
                ((string *)&ss_e,"inputs:opacity",(allocator *)&animatable_value);
      psVar26 = (string *)&ss_e;
      anon_unknown_0::ParseTypedAttribute<float>
                (&ret,&table,&local_130,prop,(string *)&ss_e,&surface->opacity);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar15 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar13 = false;
        iVar15 = 3;
      }
      else {
        bVar13 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar16 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar16 = ::std::operator<<(poVar16,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar16 = ::std::operator<<(poVar16,":");
          poVar16 = ::std::operator<<(poVar16,"ReconstructShader");
          poVar16 = ::std::operator<<(poVar16,"():");
          poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xfa6);
          ::std::operator<<(poVar16," ");
          ::std::__cxx11::string::string
                    ((string *)&ret_10,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&attr_type_name);
          fmt::format<char[15],std::__cxx11::string>
                    ((string *)&animatable_value,(fmt *)&ret_10,(string *)"inputs:opacity",
                     (char (*) [15])&ret.err,psVar26);
          poVar16 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
          ::std::operator<<(poVar16,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &animatable_value,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&animatable_value);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar13 = false;
          iVar15 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar13) goto LAB_001c7208;
      ::std::__cxx11::string::string((string *)&local_150,(string *)__x);
      ::std::__cxx11::string::string
                ((string *)&ss_e,"inputs:opacityThreshold",(allocator *)&animatable_value);
      psVar26 = (string *)&ss_e;
      anon_unknown_0::ParseTypedAttribute<float>
                (&ret,&table,&local_150,prop,(string *)&ss_e,&surface->opacityThreshold);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar15 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar13 = false;
        iVar15 = 3;
      }
      else {
        bVar13 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar16 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar16 = ::std::operator<<(poVar16,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar16 = ::std::operator<<(poVar16,":");
          poVar16 = ::std::operator<<(poVar16,"ReconstructShader");
          poVar16 = ::std::operator<<(poVar16,"():");
          poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xfa8);
          ::std::operator<<(poVar16," ");
          ::std::__cxx11::string::string
                    ((string *)&ret_10,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&attr_type_name);
          fmt::format<char[24],std::__cxx11::string>
                    ((string *)&animatable_value,(fmt *)&ret_10,(string *)"inputs:opacityThreshold",
                     (char (*) [24])&ret.err,psVar26);
          poVar16 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
          ::std::operator<<(poVar16,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &animatable_value,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&animatable_value);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar13 = false;
          iVar15 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar13) goto LAB_001c7208;
      ::std::__cxx11::string::string((string *)&local_170,(string *)__x);
      ::std::__cxx11::string::string((string *)&ss_e,"inputs:ior",(allocator *)&animatable_value);
      pPVar24 = prop;
      psVar26 = (string *)&ss_e;
      anon_unknown_0::ParseTypedAttribute<float>
                (&ret,&table,&local_170,prop,(string *)&ss_e,&surface->ior);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar15 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar13 = false;
        iVar15 = 3;
      }
      else {
        bVar13 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar16 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar16 = ::std::operator<<(poVar16,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar16 = ::std::operator<<(poVar16,":");
          poVar16 = ::std::operator<<(poVar16,"ReconstructShader");
          poVar16 = ::std::operator<<(poVar16,"():");
          poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xfaa);
          ::std::operator<<(poVar16," ");
          ::std::__cxx11::string::string
                    ((string *)&ret_10,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&attr_type_name);
          pPVar24 = (Property *)&ret.err;
          fmt::format<char[11],std::__cxx11::string>
                    ((string *)&animatable_value,(fmt *)&ret_10,(string *)"inputs:ior",
                     (char (*) [11])pPVar24,psVar26);
          poVar16 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
          ::std::operator<<(poVar16,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &animatable_value,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&animatable_value);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar13 = false;
          iVar15 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar13) goto LAB_001c7208;
      ::std::__cxx11::string::string((string *)&local_210,(string *)__x);
      ::std::__cxx11::string::string((string *)&local_4d0,"inputs:normal",&local_5ea);
      ret_10.err._M_dataplus._M_p = (pointer)&ret_10.err.field_2;
      ret_10.err._M_string_length = 0;
      ret_10.err.field_2._M_local_buf[0] = '\0';
      iVar15 = ::std::__cxx11::string::compare((string *)&local_210);
      if (iVar15 == 0) {
        if (((ulong)p_Var23[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          ret_10.code = PropertyTypeMismatch;
          ::std::__cxx11::string::string
                    ((string *)&ret,"Property {} must be Attribute, but declared as Relationhip.",
                     (allocator *)&animatable_value);
          fmt::format<std::__cxx11::string>
                    ((string *)&ss_e,(fmt *)&ret,&local_4d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar24);
          ::std::__cxx11::string::operator=((string *)&ret_10.err,(string *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
        }
        else {
          Attribute::type_name_abi_cxx11_(&attr_type_name,(Attribute *)prop);
          tinyusdz::value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
          _Var12 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&ss_e,&attr_type_name);
          if (_Var12) {
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            tinyusdz::value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
            _Var12 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&ret,&attr_type_name);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (!_Var12) {
              ret_10.code = TypeMismatch;
              ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_e);
              poVar16 = ::std::operator<<((ostream *)(auStack_3b0 + 8),"Property type mismatch. ");
              poVar16 = ::std::operator<<(poVar16,(string *)&local_4d0);
              poVar16 = ::std::operator<<(poVar16," expects type `");
              tinyusdz::value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
              poVar16 = ::std::operator<<(poVar16,(string *)&ret);
              poVar16 = ::std::operator<<(poVar16,"` but defined as type `");
              poVar16 = ::std::operator<<(poVar16,(string *)&attr_type_name);
              ::std::operator<<(poVar16,"`");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::operator=((string *)&ret_10.err,(string *)&ret);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_e);
              goto LAB_001c5e9c;
            }
          }
          p_Var4 = p_Var23[6]._M_parent;
          p_Var5 = p_Var23[6]._M_left;
          args = p_Var5;
          if (p_Var5 != p_Var4) {
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &(surface->normal)._paths,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var23[6]._M_parent);
          }
          iVar15 = *(int *)((long)&p_Var23[0x17]._M_parent + 4);
          if (iVar15 == 1) {
            bVar13 = Attribute::is_blocked((Attribute *)prop);
            if (bVar13) {
              (surface->normal)._blocked = true;
            }
            else if (p_Var23[3]._M_color == _S_black) {
              bVar13 = primvar::PrimVar::is_timesamples((PrimVar *)&p_Var23[4]._M_parent);
              if (bVar13) {
                ret_10.code = VariabilityMismatch;
                ::std::__cxx11::string::string
                          ((string *)&ret,"TimeSample value is assigned to `uniform` property `{}",
                           (allocator *)&animatable_value);
                fmt::format<std::__cxx11::string>
                          ((string *)&ss_e,(fmt *)&ret,&local_4d0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                ::std::__cxx11::string::operator=((string *)&ret_10.err,(string *)&ss_e);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              else {
                Attribute::get_value<tinyusdz::value::normal3f>
                          ((optional<tinyusdz::value::normal3f> *)&ss_e,(Attribute *)prop);
                pv.has_value_ = (bool)ss_e;
                if (ss_e == (ostringstream)0x1) {
                  pv.contained._8_4_ =
                       CONCAT22(auStack_3b0._6_2_,CONCAT11(auStack_3b0[5],auStack_3b0[4]));
                  pv.contained._0_8_ =
                       CONCAT44(auStack_3b0._0_4_,CONCAT22(sStack_3b4._2_2_,sStack_3b4._0_2_));
                  pvVar18 = nonstd::optional_lite::optional<tinyusdz::value::normal3f>::value(&pv);
                  aaStack_3a8[0]._M_local_buf[0] = '\0';
                  aaStack_3a8[0]._M_allocated_capacity._1_7_ = 0;
                  aaStack_3a8[0]._M_local_buf[8] = '\0';
                  aaStack_3a8[0]._9_7_ = 0;
                  aaStack_3a8[1]._0_1_ = 0;
                  aaStack_3a8[1]._1_8_ = 0;
                  auStack_3b0[5] = 0;
                  auStack_3b0._0_4_ = pvVar18->z;
                  uVar2 = pvVar18->x;
                  uVar6 = pvVar18->y;
                  sStack_3b4._0_2_ = (undefined2)uVar6;
                  sStack_3b4._2_2_ = (undefined2)((uint)uVar6 >> 0x10);
                  auStack_3b0[4] = 1;
                  _ss_e = uVar2;
                  nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>>::
                  operator=((optional<tinyusdz::Animatable<tinyusdz::value::normal3f>> *)this,
                            (Animatable<tinyusdz::value::normal3f> *)&ss_e);
                  ::std::
                  _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                  ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                   *)(auStack_3b0 + 8));
                  goto LAB_001c5b96;
                }
                ret_10.code = TypeMismatch;
                ::std::__cxx11::string::string
                          ((string *)&ret,
                           "Fallback. Failed to retrieve value with requested type `{}`.",
                           (allocator *)&local_3d8);
                tinyusdz::value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>
                          ((string *)&ss_e,(fmt *)&ret,(string *)&animatable_value,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                ::std::__cxx11::string::operator=((string *)&ret_10.err,(string *)&ss_e);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              goto LAB_001c5e9c;
            }
LAB_001c5b96:
            animatable_value._ts._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
            animatable_value._ts._17_8_ = 0;
            animatable_value._ts._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
            animatable_value._ts._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
            animatable_value._ts._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
            animatable_value._ts._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
            animatable_value._value.z = 0.0;
            animatable_value._has_value = false;
            animatable_value._blocked = false;
            animatable_value._value.x = 0.0;
            animatable_value._value.y._0_2_ = 0;
            animatable_value._value.y._2_2_ = 0;
            pp_Var1 = &p_Var23[4]._M_parent;
            if (p_Var23[5]._M_left == p_Var23[5]._M_parent) {
              bVar13 = false;
LAB_001c5cc9:
              bVar9 = bVar13;
              bVar13 = primvar::PrimVar::has_value((PrimVar *)pp_Var1);
              if (bVar13) {
                primvar::PrimVar::get_value<tinyusdz::value::normal3f>
                          ((optional<tinyusdz::value::normal3f> *)&ss_e,(PrimVar *)pp_Var1);
                pv_1.has_value_ = (bool)ss_e;
                if (ss_e != (ostringstream)0x1) {
                  ret_10.code = InternalError;
                  ::std::__cxx11::string::string
                            ((string *)&ret,
                             "Internal error. Invalid attribute value? get_value<{}> failed. Attribute has type {}"
                             ,&local_5e9);
                  tinyusdz::value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
                  primvar::PrimVar::type_name_abi_cxx11_(&local_3d8,(PrimVar *)pp_Var1);
                  fmt::format<std::__cxx11::string,std::__cxx11::string>
                            ((string *)&ss_e,(fmt *)&ret,(string *)&pv,&local_3d8,psVar26);
                  ::std::__cxx11::string::operator=((string *)&ret_10.err,(string *)&ss_e);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  bVar8 = false;
                  bVar14 = false;
                  bVar13 = true;
                  goto LAB_001c5e10;
                }
                pv_1.contained._8_4_ =
                     CONCAT22(auStack_3b0._6_2_,CONCAT11(auStack_3b0[5],auStack_3b0[4]));
                pv_1.contained._0_8_ =
                     CONCAT44(auStack_3b0._0_4_,CONCAT22(sStack_3b4._2_2_,sStack_3b4._0_2_));
                pvVar18 = nonstd::optional_lite::optional<tinyusdz::value::normal3f>::value(&pv_1);
                uVar3 = pvVar18->x;
                uVar7 = pvVar18->y;
                animatable_value._value.y._0_2_ = (undefined2)uVar7;
                animatable_value._value.y._2_2_ = (undefined2)((uint)uVar7 >> 0x10);
                animatable_value._value.z = pvVar18->z;
                animatable_value._has_value = true;
                animatable_value._blocked = false;
                bVar8 = true;
                animatable_value._value.x = (float)uVar3;
              }
              else {
                bVar8 = false;
              }
              if ((bVar9) || (bVar8)) {
                nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>>::
                operator=((optional<tinyusdz::Animatable<tinyusdz::value::normal3f>> *)this,
                          &animatable_value);
              }
              bVar14 = true;
              bVar13 = false;
            }
            else {
              anon_unknown_0::ConvertToAnimatable<tinyusdz::value::normal3f>
                        ((optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)&ret,
                         (PrimVar *)pp_Var1);
              nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::
              optional<tinyusdz::Animatable<tinyusdz::value::normal3f>,_0>
                        ((optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)&ss_e,
                         (optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)&ret);
              nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::
              ~optional((optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)&ret);
              oVar11 = ss_e;
              if (ss_e == (ostringstream)0x1) {
                pvVar17 = nonstd::optional_lite::
                          optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::value
                                    ((optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)
                                     &ss_e);
                Animatable<tinyusdz::value::normal3f>::operator=(&animatable_value,pvVar17);
              }
              else {
                ret_10.code = InternalError;
                ::std::__cxx11::string::string
                          ((string *)&pv,
                           "Converting timeSamples Attribute data failed for `{}`. Guess TimeSamples have values with different type(expected is `{}`)?"
                           ,(allocator *)&pv_1);
                tinyusdz::value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string,std::__cxx11::string>
                          ((string *)&ret,(fmt *)&pv,&local_210,&local_3d8,psVar26);
                ::std::__cxx11::string::operator=((string *)&ret_10.err,(string *)&ret);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::
              ~optional((optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)&ss_e);
              bVar13 = true;
              bVar8 = false;
              bVar9 = false;
              bVar14 = false;
              if (oVar11 != (ostringstream)0x0) goto LAB_001c5cc9;
            }
LAB_001c5e10:
            ::std::
            _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
            ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                             *)&animatable_value._ts);
            if (!bVar14) {
              ::std::__cxx11::string::_M_dispose();
              if (bVar13) goto LAB_001c5ea1;
              goto LAB_001c5e9c;
            }
          }
          else {
            if (iVar15 == 0) {
              (surface->normal)._empty = true;
              AttrMetas::operator=(&(surface->normal)._metas,(AttrMetas *)(p_Var23 + 7));
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_4d0);
              ret_10.code = Success;
              goto LAB_001c5e9c;
            }
            bVar8 = false;
            bVar9 = false;
          }
          if (p_Var5 == p_Var4) {
            if ((!bVar9) && (!bVar8)) {
              ::std::__cxx11::string::assign((char *)&ret_10.err);
              ret_10.code = InternalError;
              goto LAB_001c5e9c;
            }
          }
          else if ((!bVar9) && (!bVar8)) {
            (surface->normal)._empty = true;
          }
          AttrMetas::operator=(&(surface->normal)._metas,(AttrMetas *)(p_Var23 + 7));
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&table,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4d0
                    );
          ret_10.code = Success;
        }
LAB_001c5e9c:
        ::std::__cxx11::string::_M_dispose();
      }
      else {
        ret_10.code = Unmatched;
      }
LAB_001c5ea1:
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar15 = 0;
      if ((ret_10.code & ~AlreadyProcessed) == Success) {
        iVar15 = 3;
LAB_001c600a:
        bVar13 = false;
      }
      else {
        bVar13 = true;
        if (ret_10.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar16 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar16 = ::std::operator<<(poVar16,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar16 = ::std::operator<<(poVar16,":");
          poVar16 = ::std::operator<<(poVar16,"ReconstructShader");
          poVar16 = ::std::operator<<(poVar16,"():");
          poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xfac);
          ::std::operator<<(poVar16," ");
          ::std::__cxx11::string::string
                    ((string *)&animatable_value,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&attr_type_name);
          fmt::format<char[14],std::__cxx11::string>
                    ((string *)&ret,(fmt *)&animatable_value,(string *)"inputs:normal",
                     (char (*) [14])&ret_10.err,psVar26);
          poVar16 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
          ::std::operator<<(poVar16,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&animatable_value,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&ret);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          iVar15 = 1;
          goto LAB_001c600a;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar13) goto LAB_001c7208;
      ::std::__cxx11::string::string((string *)&local_190,(string *)__x);
      ::std::__cxx11::string::string
                ((string *)&ss_e,"inputs:dispacement",(allocator *)&animatable_value);
      args_1 = (optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)&ss_e;
      anon_unknown_0::ParseTypedAttribute<float>
                (&ret,&table,&local_190,prop,(string *)&ss_e,&surface->displacement);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar15 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar13 = false;
        iVar15 = 3;
      }
      else {
        bVar13 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar16 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar16 = ::std::operator<<(poVar16,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar16 = ::std::operator<<(poVar16,":");
          poVar16 = ::std::operator<<(poVar16,"ReconstructShader");
          poVar16 = ::std::operator<<(poVar16,"():");
          poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xfae);
          ::std::operator<<(poVar16," ");
          ::std::__cxx11::string::string
                    ((string *)&ret_10,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&attr_type_name);
          fmt::format<char[19],std::__cxx11::string>
                    ((string *)&animatable_value,(fmt *)&ret_10,(string *)"inputs:dispacement",
                     (char (*) [19])&ret.err,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar16 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
          ::std::operator<<(poVar16,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &animatable_value,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&animatable_value);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar13 = false;
          iVar15 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar13) goto LAB_001c7208;
      ::std::__cxx11::string::string((string *)&local_1b0,(string *)__x);
      ::std::__cxx11::string::string
                ((string *)&ss_e,"inputs:occlusion",(allocator *)&animatable_value);
      pPVar24 = prop;
      psVar26 = (string *)&ss_e;
      anon_unknown_0::ParseTypedAttribute<float>
                (&ret,&table,&local_1b0,prop,(string *)&ss_e,&surface->occlusion);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar15 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar13 = false;
        iVar15 = 3;
      }
      else {
        bVar13 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar16 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar16 = ::std::operator<<(poVar16,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar16 = ::std::operator<<(poVar16,":");
          poVar16 = ::std::operator<<(poVar16,"ReconstructShader");
          poVar16 = ::std::operator<<(poVar16,"():");
          poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xfb0);
          ::std::operator<<(poVar16," ");
          ::std::__cxx11::string::string
                    ((string *)&ret_10,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&attr_type_name);
          pPVar24 = (Property *)&ret.err;
          fmt::format<char[17],std::__cxx11::string>
                    ((string *)&animatable_value,(fmt *)&ret_10,(string *)"inputs:occlusion",
                     (char (*) [17])pPVar24,psVar26);
          poVar16 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
          ::std::operator<<(poVar16,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &animatable_value,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&animatable_value);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar13 = false;
          iVar15 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar13) goto LAB_001c7208;
      ::std::__cxx11::string::string((string *)&local_230,(string *)__x);
      ::std::__cxx11::string::string((string *)&local_4d0,"inputs:useSpecularWorkflow",&local_5ea);
      ret_10.err._M_dataplus._M_p = (pointer)&ret_10.err.field_2;
      ret_10.err._M_string_length = 0;
      ret_10.err.field_2._M_local_buf[0] = '\0';
      iVar15 = ::std::__cxx11::string::compare((string *)&local_230);
      if (iVar15 == 0) {
        if (((ulong)p_Var23[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          ret_10.code = PropertyTypeMismatch;
          ::std::__cxx11::string::string
                    ((string *)&ret,"Property {} must be Attribute, but declared as Relationhip.",
                     (allocator *)&animatable_value);
          fmt::format<std::__cxx11::string>
                    ((string *)&ss_e,(fmt *)&ret,&local_4d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar24);
          ::std::__cxx11::string::operator=((string *)&ret_10.err,(string *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
        }
        else {
          Attribute::type_name_abi_cxx11_(&attr_type_name,(Attribute *)prop);
          tinyusdz::value::TypeTraits<int>::type_name_abi_cxx11_();
          _Var12 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&ss_e,&attr_type_name);
          if (_Var12) {
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            tinyusdz::value::TypeTraits<int>::underlying_type_name_abi_cxx11_();
            _Var12 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&ret,&attr_type_name);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (!_Var12) {
              ret_10.code = TypeMismatch;
              ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_e);
              poVar16 = ::std::operator<<((ostream *)(auStack_3b0 + 8),"Property type mismatch. ");
              poVar16 = ::std::operator<<(poVar16,(string *)&local_4d0);
              poVar16 = ::std::operator<<(poVar16," expects type `");
              tinyusdz::value::TypeTraits<int>::type_name_abi_cxx11_();
              poVar16 = ::std::operator<<(poVar16,(string *)&ret);
              poVar16 = ::std::operator<<(poVar16,"` but defined as type `");
              poVar16 = ::std::operator<<(poVar16,(string *)&attr_type_name);
              ::std::operator<<(poVar16,"`");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::operator=((string *)&ret_10.err,(string *)&ret);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_e);
              goto LAB_001c6b56;
            }
          }
          p_Var4 = p_Var23[6]._M_parent;
          p_Var5 = p_Var23[6]._M_left;
          if (p_Var5 != p_Var4) {
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &(surface->useSpecularWorkflow)._paths,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var23[6]._M_parent);
          }
          iVar15 = *(int *)((long)&p_Var23[0x17]._M_parent + 4);
          if (iVar15 == 1) {
            bVar13 = Attribute::is_blocked((Attribute *)prop);
            if (bVar13) {
              (surface->useSpecularWorkflow)._blocked = true;
            }
            else if (p_Var23[3]._M_color == _S_black) {
              bVar13 = primvar::PrimVar::is_timesamples((PrimVar *)&p_Var23[4]._M_parent);
              if (bVar13) {
                ret_10.code = VariabilityMismatch;
                ::std::__cxx11::string::string
                          ((string *)&ret,"TimeSample value is assigned to `uniform` property `{}",
                           (allocator *)&animatable_value);
                fmt::format<std::__cxx11::string>
                          ((string *)&ss_e,(fmt *)&ret,&local_4d0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pPVar24);
                ::std::__cxx11::string::operator=((string *)&ret_10.err,(string *)&ss_e);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                goto LAB_001c6b56;
              }
              Attribute::get_value<int>((optional<int> *)&ss_e,(Attribute *)prop);
              uVar10 = pv.contained._0_8_;
              pv.has_value_ = (bool)ss_e;
              if (ss_e != (ostringstream)0x1) {
                ret_10.code = TypeMismatch;
                ::std::__cxx11::string::string
                          ((string *)&ret,
                           "Fallback. Failed to retrieve value with requested type `{}`.",
                           (allocator *)&local_3d8);
                tinyusdz::value::TypeTraits<int>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>
                          ((string *)&ss_e,(fmt *)&ret,(string *)&animatable_value,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pPVar24);
                ::std::__cxx11::string::operator=((string *)&ret_10.err,(string *)&ss_e);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                goto LAB_001c6b5b;
              }
              pv.contained._2_2_ = sStack_3b4._2_2_;
              pv.contained._0_2_ = sStack_3b4._0_2_;
              pv.contained._4_4_ = SUB84(uVar10,4);
              pvVar19 = nonstd::optional_lite::optional<int>::value((optional<int> *)&pv);
              auStack_3b0._0_4_ = 0.0;
              auStack_3b0[4] = 0;
              auStack_3b0[5] = 0;
              auStack_3b0._6_2_ = 0;
              aaStack_3a8[0]._M_local_buf[0] = '\0';
              aaStack_3a8[0]._M_allocated_capacity._1_7_ = 0;
              aaStack_3a8[0]._M_local_buf[8] = '\0';
              aaStack_3a8[0]._9_7_ = 0;
              aaStack_3a8[1]._0_1_ = 0;
              _ss_e = *pvVar19;
              sStack_3b4._0_2_ = 1;
              nonstd::optional_lite::optional<tinyusdz::Animatable<int>>::operator=
                        ((optional<tinyusdz::Animatable<int>> *)this_00,(Animatable<int> *)&ss_e);
              ::std::
              _Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
              ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                               *)auStack_3b0);
            }
            animatable_value._value.x = 0.0;
            animatable_value._value.y._0_2_ = 0;
            animatable_value._ts._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
            animatable_value._ts._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
            animatable_value._ts._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
            animatable_value._value.z = 0.0;
            animatable_value._has_value = false;
            animatable_value._blocked = false;
            animatable_value._14_2_ = 0;
            animatable_value._ts._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
            animatable_value._ts._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
            pp_Var1 = &p_Var23[4]._M_parent;
            if (p_Var23[5]._M_left == p_Var23[5]._M_parent) {
              bVar9 = false;
LAB_001c6983:
              bVar13 = bVar9;
              bVar14 = primvar::PrimVar::has_value((PrimVar *)pp_Var1);
              if (bVar14) {
                primvar::PrimVar::get_value<int>((optional<int> *)&ss_e,(PrimVar *)pp_Var1);
                uVar10 = pv_1.contained._0_8_;
                pv_1.has_value_ = (bool)ss_e;
                if (ss_e != (ostringstream)0x1) {
                  ret_10.code = InternalError;
                  ::std::__cxx11::string::string
                            ((string *)&ret,
                             "Internal error. Invalid attribute value? get_value<{}> failed. Attribute has type {}"
                             ,&local_5e9);
                  tinyusdz::value::TypeTraits<int>::type_name_abi_cxx11_();
                  primvar::PrimVar::type_name_abi_cxx11_(&local_3d8,(PrimVar *)pp_Var1);
                  fmt::format<std::__cxx11::string,std::__cxx11::string>
                            ((string *)&ss_e,(fmt *)&ret,(string *)&pv,&local_3d8,psVar26);
                  ::std::__cxx11::string::operator=((string *)&ret_10.err,(string *)&ss_e);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  bVar14 = false;
                  bVar8 = false;
                  bVar9 = true;
                  goto LAB_001c6ac9;
                }
                pv_1.contained._2_2_ = sStack_3b4._2_2_;
                pv_1.contained._0_2_ = sStack_3b4._0_2_;
                pv_1.contained._4_4_ = SUB84(uVar10,4);
                pfVar21 = (float *)nonstd::optional_lite::optional<int>::value
                                             ((optional<int> *)&pv_1);
                animatable_value._value.x = *pfVar21;
                animatable_value._value.y._0_2_ = 1;
                bVar14 = true;
              }
              else {
                bVar14 = false;
              }
              if ((bVar13) || (bVar14)) {
                nonstd::optional_lite::optional<tinyusdz::Animatable<int>>::operator=
                          ((optional<tinyusdz::Animatable<int>> *)this_00,
                           (Animatable<int> *)&animatable_value);
              }
              bVar8 = true;
              bVar9 = false;
            }
            else {
              anon_unknown_0::ConvertToAnimatable<int>
                        ((optional<tinyusdz::Animatable<int>_> *)&ret,(PrimVar *)pp_Var1);
              nonstd::optional_lite::optional<tinyusdz::Animatable<int>_>::
              optional<tinyusdz::Animatable<int>,_0>
                        ((optional<tinyusdz::Animatable<int>_> *)&ss_e,
                         (optional<tinyusdz::Animatable<int>_> *)&ret);
              nonstd::optional_lite::optional<tinyusdz::Animatable<int>_>::~optional
                        ((optional<tinyusdz::Animatable<int>_> *)&ret);
              oVar11 = ss_e;
              if (ss_e == (ostringstream)0x1) {
                pvVar20 = nonstd::optional_lite::optional<tinyusdz::Animatable<int>_>::value
                                    ((optional<tinyusdz::Animatable<int>_> *)&ss_e);
                Animatable<int>::operator=((Animatable<int> *)&animatable_value,pvVar20);
              }
              else {
                ret_10.code = InternalError;
                ::std::__cxx11::string::string
                          ((string *)&pv,
                           "Converting timeSamples Attribute data failed for `{}`. Guess TimeSamples have values with different type(expected is `{}`)?"
                           ,(allocator *)&pv_1);
                tinyusdz::value::TypeTraits<int>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string,std::__cxx11::string>
                          ((string *)&ret,(fmt *)&pv,&local_230,&local_3d8,psVar26);
                ::std::__cxx11::string::operator=((string *)&ret_10.err,(string *)&ret);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              nonstd::optional_lite::optional<tinyusdz::Animatable<int>_>::~optional
                        ((optional<tinyusdz::Animatable<int>_> *)&ss_e);
              bVar9 = true;
              bVar14 = false;
              bVar13 = false;
              bVar8 = false;
              if (oVar11 != (ostringstream)0x0) goto LAB_001c6983;
            }
LAB_001c6ac9:
            ::std::
            _Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
            ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                             *)&animatable_value._value.z);
            if (!bVar8) {
              ::std::__cxx11::string::_M_dispose();
              if (bVar9) goto LAB_001c6b5b;
              goto LAB_001c6b56;
            }
LAB_001c6af1:
            if (p_Var5 == p_Var4) {
              if ((!bVar13) && (!bVar14)) {
                ::std::__cxx11::string::assign((char *)&ret_10.err);
                ret_10.code = InternalError;
                goto LAB_001c6b56;
              }
            }
            else if ((!bVar13) && (!bVar14)) goto LAB_001c6573;
          }
          else {
            if (iVar15 != 0) {
              bVar14 = false;
              bVar13 = false;
              goto LAB_001c6af1;
            }
LAB_001c6573:
            (surface->useSpecularWorkflow)._empty = true;
          }
          AttrMetas::operator=(&(surface->useSpecularWorkflow)._metas,(AttrMetas *)(p_Var23 + 7));
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&table,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4d0
                    );
          ret_10.code = Success;
        }
LAB_001c6b56:
        ::std::__cxx11::string::_M_dispose();
      }
      else {
        ret_10.code = Unmatched;
      }
LAB_001c6b5b:
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar15 = 0;
      if ((ret_10.code & ~AlreadyProcessed) == Success) {
        iVar15 = 3;
LAB_001c6cc4:
        bVar13 = false;
      }
      else {
        bVar13 = true;
        if (ret_10.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar16 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar16 = ::std::operator<<(poVar16,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar16 = ::std::operator<<(poVar16,":");
          poVar16 = ::std::operator<<(poVar16,"ReconstructShader");
          poVar16 = ::std::operator<<(poVar16,"():");
          poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xfb2);
          ::std::operator<<(poVar16," ");
          ::std::__cxx11::string::string
                    ((string *)&animatable_value,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&attr_type_name);
          fmt::format<char[27],std::__cxx11::string>
                    ((string *)&ret,(fmt *)&animatable_value,(string *)"inputs:useSpecularWorkflow",
                     (char (*) [27])&ret_10.err,psVar26);
          poVar16 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
          ::std::operator<<(poVar16,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&animatable_value,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&ret);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          iVar15 = 1;
          goto LAB_001c6cc4;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar13) goto LAB_001c7208;
      ::std::__cxx11::string::string((string *)&local_1d0,(string *)__x);
      ::std::__cxx11::string::string
                ((string *)&ss_e,"outputs:surface",(allocator *)&animatable_value);
      psVar26 = (string *)&ss_e;
      anon_unknown_0::ParseShaderOutputTerminalAttribute<tinyusdz::Token>
                (&ret,&table,&local_1d0,prop,(string *)&ss_e,&surface->outputsSurface);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar15 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar13 = false;
        iVar15 = 3;
      }
      else {
        bVar13 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar16 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar16 = ::std::operator<<(poVar16,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar16 = ::std::operator<<(poVar16,":");
          poVar16 = ::std::operator<<(poVar16,"ReconstructShader");
          poVar16 = ::std::operator<<(poVar16,"():");
          poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xfb4);
          ::std::operator<<(poVar16," ");
          ::std::__cxx11::string::string
                    ((string *)&ret_10,"Parsing shader output property `{}` failed. Error: {}",
                     (allocator *)&attr_type_name);
          fmt::format<char[16],std::__cxx11::string>
                    ((string *)&animatable_value,(fmt *)&ret_10,(string *)"outputs:surface",
                     (char (*) [16])&ret.err,psVar26);
          poVar16 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
          ::std::operator<<(poVar16,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &animatable_value,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&animatable_value);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar13 = false;
          iVar15 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar13) goto LAB_001c7208;
      ::std::__cxx11::string::string((string *)&local_1f0,(string *)__x);
      ::std::__cxx11::string::string
                ((string *)&ss_e,"outputs:displacement",(allocator *)&animatable_value);
      psVar26 = (string *)&ss_e;
      anon_unknown_0::ParseShaderOutputTerminalAttribute<tinyusdz::Token>
                (&ret,&table,&local_1f0,prop,(string *)&ss_e,&surface->outputsDisplacement);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar15 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar13 = false;
        iVar15 = 3;
      }
      else {
        bVar13 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar16 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar16 = ::std::operator<<(poVar16,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar16 = ::std::operator<<(poVar16,":");
          poVar16 = ::std::operator<<(poVar16,"ReconstructShader");
          poVar16 = ::std::operator<<(poVar16,"():");
          poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xfb6);
          ::std::operator<<(poVar16," ");
          ::std::__cxx11::string::string
                    ((string *)&ret_10,"Parsing shader output property `{}` failed. Error: {}",
                     (allocator *)&attr_type_name);
          fmt::format<char[21],std::__cxx11::string>
                    ((string *)&animatable_value,(fmt *)&ret_10,(string *)"outputs:displacement",
                     (char (*) [21])&ret.err,psVar26);
          poVar16 = ::std::operator<<((ostream *)&ss_e,(string *)&animatable_value);
          ::std::operator<<(poVar16,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &animatable_value,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&animatable_value);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar13 = false;
          iVar15 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar13) goto LAB_001c7208;
      sVar22 = ::std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::count(&table,(key_type *)__x);
      if (sVar22 == 0) {
        this_01 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                  ::operator[](&(surface->super_ShaderNode).super_UsdShadePrim.props,(key_type *)__x
                              );
        Property::operator=(this_01,prop);
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&table,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x);
      }
      sVar22 = ::std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::count(&table,(key_type *)__x);
      if (sVar22 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar16 = ::std::operator<<((ostream *)&ss_e,"[warn]");
        poVar16 = ::std::operator<<(poVar16,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   );
        poVar16 = ::std::operator<<(poVar16,":");
        poVar16 = ::std::operator<<(poVar16,"ReconstructShader");
        poVar16 = ::std::operator<<(poVar16,"():");
        poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xfb8);
        ::std::operator<<(poVar16," ");
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,
                         "Unsupported/unimplemented property: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x);
        poVar16 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
        ::std::operator<<(poVar16,"\n");
        ::std::__cxx11::string::_M_dispose();
        if (warn != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &animatable_value,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err)
          ;
          ::std::__cxx11::string::operator=((string *)warn,(string *)&ret);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      }
    }
    else {
LAB_001c7208:
      if ((iVar15 != 3) && (iVar15 != 0)) break;
    }
    p_Var23 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var23);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&table._M_t);
  return (_Rb_tree_header *)p_Var23 == p_Var25;
}

Assistant:

bool ReconstructShader<UsdPreviewSurface>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPreviewSurface *surface,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  (void)spec;
  (void)references;
  (void)options;

  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:diffuseColor", UsdPreviewSurface,
                         surface->diffuseColor)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:emissiveColor", UsdPreviewSurface,
                         surface->emissiveColor)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:roughness", UsdPreviewSurface,
                         surface->roughness)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:specularColor", UsdPreviewSurface,
                         surface->specularColor)  // specular workflow
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:metallic", UsdPreviewSurface,
                         surface->metallic)  // non specular workflow
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:clearcoat", UsdPreviewSurface,
                         surface->clearcoat)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:clearcoatRoughness",
                         UsdPreviewSurface, surface->clearcoatRoughness)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:opacity", UsdPreviewSurface,
                         surface->opacity)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:opacityThreshold",
                         UsdPreviewSurface, surface->opacityThreshold)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:ior", UsdPreviewSurface,
                         surface->ior)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:normal", UsdPreviewSurface,
                         surface->normal)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:dispacement", UsdPreviewSurface,
                         surface->displacement)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:occlusion", UsdPreviewSurface,
                         surface->occlusion)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:useSpecularWorkflow",
                         UsdPreviewSurface, surface->useSpecularWorkflow)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:surface", UsdPreviewSurface,
                   surface->outputsSurface)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:displacement", UsdPreviewSurface,
                   surface->outputsDisplacement)
    ADD_PROPERTY(table, prop, UsdPreviewSurface, surface->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}